

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap-reduce.cpp
# Opt level: O0

void redistribute(void *b_,ReduceProxy *srp,RegularSwapPartners *partners)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pfVar6;
  BlockID BVar7;
  reference this;
  Link *f;
  ReduceProxy *in_RSI;
  long in_RDI;
  float fVar8;
  float fVar9;
  double in_XMM0_Qa;
  double dVar10;
  float new_max;
  float new_min;
  int i_2;
  int pos;
  size_t loc;
  size_t i_1;
  int cur_dim;
  int group_size;
  vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
  out_points;
  size_t j;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> in_points;
  int nbr_gid;
  int i;
  uint round;
  Block *b;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  BlockID *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  size_type in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  float fVar11;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  uint *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  char (*in_stack_fffffffffffffe60) [38];
  FILE *in_stack_fffffffffffffe68;
  int local_b8;
  int local_b0;
  int local_ac;
  ulong local_a0;
  vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
  local_88;
  ulong local_70;
  undefined4 local_64;
  int local_60;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> local_50;
  BlockID local_34;
  int local_2c;
  int local_28;
  long local_20;
  ReduceProxy *local_10;
  
  local_20 = in_RDI;
  local_10 = in_RSI;
  diy::ReduceProxy::round(in_RSI,in_XMM0_Qa);
  local_28 = 0;
  while( true ) {
    iVar3 = local_28;
    diy::ReduceProxy::in_link(local_10);
    iVar2 = diy::Link::size((Link *)0x14c5b1);
    if (iVar2 <= iVar3) break;
    diy::ReduceProxy::in_link(local_10);
    local_34 = diy::Link::target((Link *)CONCAT44(in_stack_fffffffffffffdcc,
                                                  in_stack_fffffffffffffdc8),0);
    iVar3 = local_34.gid;
    local_2c = local_34.gid;
    iVar2 = diy::Master::Proxy::gid(&local_10->super_Proxy);
    if (iVar3 != iVar2) {
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      vector((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)0x14c636);
      diy::Master::Proxy::
      dequeue<std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>>
                ((Proxy *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                 (vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (_func_void_BinaryBuffer_ptr_vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_60 = diy::Master::Proxy::gid(&local_10->super_Proxy);
      sVar4 = Catch::clara::std::
              vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size
                        (&local_50);
      local_64 = (undefined4)sVar4;
      fmt::v7::print<char[38],int,unsigned_int&,int,int&,char>
                (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      for (local_70 = 0; uVar1 = local_70,
          sVar4 = Catch::clara::std::
                  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size
                            (&local_50), uVar1 < sVar4; local_70 = local_70 + 1) {
        Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
        operator[](&local_50,local_70);
        Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
        push_back((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                  CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  (value_type *)in_stack_fffffffffffffdd8);
      }
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      ~vector((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
              CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    }
    local_28 = local_28 + 1;
  }
  diy::ReduceProxy::out_link(local_10);
  iVar3 = diy::Link::size((Link *)0x14c7ca);
  if (iVar3 != 0) {
    diy::ReduceProxy::out_link(local_10);
    diy::Link::size((Link *)0x14c7e9);
    Catch::clara::std::
    allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
    allocator((allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>
               *)0x14c808);
    Catch::clara::std::
    vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
    ::vector((vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    Catch::clara::std::
    allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
    ~allocator((allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>
                *)0x14c834);
    diy::ReduceProxy::out_link(local_10);
    iVar3 = diy::Link::size((Link *)0x14c858);
    diy::RegularPartners::dim
              ((RegularPartners *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdcc);
    for (local_a0 = 0;
        sVar4 = Catch::clara::std::
                vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::size
                          ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *
                           )(local_20 + 0x100)), local_a0 < sVar4; local_a0 = local_a0 + 1) {
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      operator[]((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 (local_20 + 0x100),local_a0);
      pvVar5 = Catch::clara::std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      fVar8 = *pvVar5;
      pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      fVar9 = *pfVar6;
      pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      fVar11 = *pfVar6;
      pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      dVar10 = floor((double)(((fVar8 - fVar9) / (fVar11 - *pfVar6)) * (float)iVar3));
      Catch::clara::std::
      vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
      ::operator[](&local_88,
                   (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      operator[]((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                 (local_20 + 0x100),local_a0);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      push_back((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                (value_type *)in_stack_fffffffffffffdd8);
    }
    local_ac = -1;
    for (local_b0 = 0; local_b0 < iVar3; local_b0 = local_b0 + 1) {
      diy::ReduceProxy::out_link(local_10);
      BVar7 = diy::Link::target((Link *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8
                                                ),0);
      local_b8 = BVar7.gid;
      iVar2 = diy::Master::Proxy::gid(&local_10->super_Proxy);
      if (local_b8 == iVar2) {
        Catch::clara::std::
        vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
        ::operator[](&local_88,(long)local_b0);
        Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
        swap((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
             in_stack_fffffffffffffdd8);
        local_ac = local_b0;
      }
      else {
        diy::ReduceProxy::out_link(local_10);
        diy::Link::target((Link *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0);
        Catch::clara::std::
        vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
        ::operator[](&local_88,(long)local_b0);
        diy::Master::Proxy::
        enqueue<std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>>
                  ((Proxy *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffdd8,
                   (vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   (_func_void_BinaryBuffer_ptr_vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_ptr
                    *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        diy::Master::Proxy::gid(&local_10->super_Proxy);
        this = Catch::clara::std::
               vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
               ::operator[](&local_88,(long)local_b0);
        Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
        size(this);
        f = diy::ReduceProxy::out_link(local_10);
        BVar7 = diy::Link::target((Link *)CONCAT44(in_stack_fffffffffffffdcc,
                                                   in_stack_fffffffffffffdc8),0);
        fmt::v7::print<char[29],int,int,int,char>
                  ((FILE *)f,(char (*) [29])BVar7,in_stack_fffffffffffffe38,
                   in_stack_fffffffffffffe30,
                   (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
    }
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    fVar8 = *pfVar6;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    fVar9 = *pfVar6;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    fVar8 = ((fVar9 - *pfVar6) / (float)iVar3) * (float)local_ac + fVar8;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    fVar9 = *pfVar6;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    fVar11 = *pfVar6;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    fVar9 = ((fVar11 - *pfVar6) / (float)iVar3) * (float)(local_ac + 1) + fVar9;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    *pfVar6 = fVar8;
    pfVar6 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(fVar9,in_stack_fffffffffffffdd0),
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    *pfVar6 = fVar9;
    Catch::clara::std::
    vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
    ::~vector((vector<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>,_std::allocator<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>_>
               *)CONCAT44(fVar8,in_stack_fffffffffffffde0));
  }
  return;
}

Assistant:

void redistribute(void* b_,                                 // local block
                  const diy::ReduceProxy& srp,              // communication proxy
                  const diy::RegularSwapPartners& partners) // partners of the current block
{
    Block*        b        = static_cast<Block*>(b_);
    unsigned      round    = srp.round();                   // current round number

    // step 1: dequeue
    // dequeue all the incoming points and add them to this block's vector
    // could use srp.incoming() instead
    for (int i = 0; i < srp.in_link().size(); ++i)
    {
        int nbr_gid = srp.in_link().target(i).gid;
        if (nbr_gid == srp.gid())
            continue;

        std::vector<Block::Point>    in_points;
        srp.dequeue(nbr_gid, in_points);
        fmt::print(stderr, "[{}:{}] Received {} points from [{}]\n",
                   srp.gid(), round, (int) in_points.size(), nbr_gid);
        for (size_t j = 0; j < in_points.size(); ++j)
            b->points.push_back(in_points[j]);
    }

    // step 2: sort and enqueue
    if (srp.out_link().size() == 0)        // final round; nothing needs to be sent
        return;

    std::vector< std::vector<Block::Point> > out_points(srp.out_link().size());
    int group_size = srp.out_link().size();  // number of outbound partners
    int cur_dim    = partners.dim(round);    // current dimension along which groups are formed
    // sort points into vectors corresponding to neighbor blocks
    for (size_t i = 0; i < b->points.size(); ++i) // for all points
    {
        auto loc = static_cast<size_t>(floor((b->points[i][cur_dim] - b->box.min[cur_dim]) /
                                            (b->box.max[cur_dim] - b->box.min[cur_dim]) * group_size));
        out_points[loc].push_back(b->points[i]);
    }
    int pos = -1;
    // enqueue points to neighbor blocks
    for (int i = 0; i < group_size; ++i)     // for all neighbors
    {
        if (srp.out_link().target(i).gid == srp.gid())
        {
            b->points.swap(out_points[i]);
            pos = i;
        }
        else
        {
            srp.enqueue(srp.out_link().target(i), out_points[i]);
            fmt::print(stderr, "[{}] Sent {} points to [{}]\n",
                       srp.gid(), (int) out_points[i].size(), srp.out_link().target(i).gid);
        }
    }

    // step 3: readjust box boundaries for next round
    float new_min = b->box.min[cur_dim] + (b->box.max[cur_dim] -
                                           b->box.min[cur_dim])/group_size*pos;
    float new_max = b->box.min[cur_dim] + (b->box.max[cur_dim] -
                                           b->box.min[cur_dim])/group_size*(pos + 1);
    b->box.min[cur_dim] = new_min;
    b->box.max[cur_dim] = new_max;
}